

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_warn_undefs_op(sexp ctx,sexp self,sexp_sint_t n,sexp from,sexp to,sexp res)

{
  sexp psVar1;
  sexp in_RCX;
  sexp in_RDI;
  sexp in_R8;
  sexp in_R9;
  bool bVar2;
  sexp ignore;
  sexp x;
  sexp local_48;
  sexp local_38;
  
  if (((in_R9 == (sexp)0x0) || (((ulong)in_R9 & 3) != 0)) || (in_R9->tag != 0x13)) {
    local_48 = (sexp)&DAT_0000023e;
  }
  else {
    local_48 = (in_R9->value).type.slots;
  }
  local_38 = in_RCX;
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0x17)) {
    local_38 = (in_RCX->value).type.slots;
    in_RCX = local_38;
  }
  while( true ) {
    bVar2 = false;
    if ((((ulong)local_38 & 3) == 0) && (bVar2 = false, local_38->tag == 6)) {
      bVar2 = local_38 != in_R8;
    }
    if (!bVar2) break;
    if (((((local_38->value).type.cpl == (sexp)0x53e) && ((local_38->value).type.name != local_48))
        && ((((local_38->value).stack.length & 3) != 0 ||
            (((local_38->value).type.name)->tag != 0x16)))) &&
       (psVar1 = sexp_memq_op(in_RDI,(sexp)0x0,2,(local_38->value).type.name,local_48),
       psVar1 == (sexp)&DAT_0000003e)) {
      sexp_warn(in_RCX,(char *)in_R8,in_R9);
    }
    local_38 = (local_38->value).type.slots;
  }
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_warn_undefs_op (sexp ctx, sexp self, sexp_sint_t n, sexp from, sexp to, sexp res) {
  sexp x, ignore = (res && sexp_exceptionp(res)) ? sexp_exception_irritants(res) : SEXP_NULL;
  if (sexp_envp(from)) from = sexp_env_bindings(from);
  for (x=from; sexp_pairp(x) && x!=to; x=sexp_env_next_cell(x))
    if (sexp_cdr(x) == SEXP_UNDEF && sexp_car(x) != ignore
        && !sexp_synclop(sexp_car(x))
        && sexp_not(sexp_memq(ctx, sexp_car(x), ignore)))
      sexp_warn(ctx, "reference to undefined variable: ", sexp_car(x));
  return SEXP_VOID;
}